

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

Vector * VectorTriangleNormal(Vector v1,Vector v2,Vector v3)

{
  Vector *in_RDI;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  undefined8 in_stack_00000008;
  
  lVar1 = (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) -
          (longdouble)CONCAT28(v1.x._0_2_,in_stack_00000008);
  lVar5 = (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) -
          (longdouble)CONCAT28(v1.x._0_2_,in_stack_00000008);
  lVar2 = ((longdouble)v2._8_10_ - (longdouble)v1._8_10_) *
          ((longdouble)v3._24_10_ - (longdouble)v1._24_10_) -
          ((longdouble)v2._24_10_ - (longdouble)v1._24_10_) *
          ((longdouble)v3._8_10_ - (longdouble)v1._8_10_);
  lVar3 = ((longdouble)v2._24_10_ - (longdouble)v1._24_10_) * lVar5 -
          ((longdouble)v3._24_10_ - (longdouble)v1._24_10_) * lVar1;
  lVar4 = lVar1 * ((longdouble)v3._8_10_ - (longdouble)v1._8_10_) -
          ((longdouble)v2._8_10_ - (longdouble)v1._8_10_) * lVar5;
  lVar5 = SQRT(lVar4 * lVar4 + lVar2 * lVar2 + lVar3 * lVar3);
  lVar1 = _DAT_0010d210;
  if (lVar5 != (longdouble)0) {
    lVar1 = lVar5;
  }
  if (NAN(lVar5) || NAN((longdouble)0)) {
    lVar1 = lVar5;
  }
  *(longdouble *)&in_RDI->x = lVar2 / lVar1;
  *(longdouble *)&in_RDI->y = lVar3 / lVar1;
  *(longdouble *)&in_RDI->z = lVar4 / lVar1;
  return in_RDI;
}

Assistant:

Vector VectorTriangleNormal(const Vector v1, const Vector v2, const Vector v3) { return VectorL2Normalization(VectorCrossProduct(VectorSubtraction(v2, v1), VectorSubtraction(v3, v1))); }